

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefEventDriven.cpp
# Opt level: O2

double __thiscall
JointBeliefEventDriven::Update
          (JointBeliefEventDriven *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI
          ,Index newJOI)

{
  JointBeliefEventDriven *pJVar1;
  char cVar2;
  int iVar3;
  size_type size;
  long lVar4;
  TransitionModelMapping *this_00;
  EventObservationModelMapping *this_01;
  Matrix *pMVar5;
  Matrix *pMVar6;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *m;
  matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
  *this_02;
  ostream *poVar7;
  long lVar8;
  E *this_03;
  int safety_h;
  uint uVar9;
  const_iterator __position;
  int iVar10;
  result_type rVar11;
  double dVar12;
  double dVar13;
  Matrix *local_110;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_108;
  double eta;
  JointBeliefEventDriven *local_f8;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> bUpdated;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> b;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> res;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  H;
  iterator local_70;
  iterator local_60;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> *local_50
  ;
  pointer local_48;
  undefined1 local_40 [16];
  
  cVar2 = (**(code **)((long)*pu + 0x140))(pu);
  if (cVar2 == '\0') {
    this_03 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_03,"Trying to use a JointBeliefEventDriven on a model without event observability.");
    __cxa_throw(this_03,&E::typeinfo,E::~E);
  }
  size = (**(code **)((long)*pu + 0x30))(pu);
  lVar4 = (**(code **)((long)*pu + 0x130))(pu);
  if (lVar4 == 0) {
    this_00 = (TransitionModelMapping *)0x0;
  }
  else {
    this_00 = (TransitionModelMapping *)
              __dynamic_cast(lVar4,&TransitionModelDiscrete::typeinfo,
                             &TransitionModelMapping::typeinfo,0);
  }
  lVar4 = (**(code **)((long)*pu + 0x138))(pu);
  if (lVar4 == 0) {
    this_01 = (EventObservationModelMapping *)0x0;
  }
  else {
    this_01 = (EventObservationModelMapping *)
              __dynamic_cast(lVar4,&ObservationModelDiscrete::typeinfo,
                             &EventObservationModelMapping::typeinfo,0);
  }
  eta = 0.0;
  dVar13 = 0.0;
  if ((this_00 != (TransitionModelMapping *)0x0) && (this_01 != (EventObservationModelMapping *)0x0)
     ) {
    pMVar5 = TransitionModelMapping::GetMatrixPtr(this_00,lastJAI);
    pMVar6 = EventObservationModelMapping::GetMatrixPtr(this_01,lastJAI,newJOI);
    m = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         *)operator_new(0x28);
    H.size1_ = (size_type)pMVar5;
    H.size2_ = (size_type)pMVar6;
    boost::numeric::ublas::
    matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
    ::
    matrix<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              ((matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                *)m,(matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                     *)&H);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(&H,m);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::vector
              (&b,size);
    local_48 = b.data_.data_;
    local_f8 = this;
    local_50 = &b;
    std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::iterator>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_40,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               *(double **)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)),
               *(iterator **)(&this->field_0x18 + *(long *)(*(long *)this + -0xd8)));
    bUpdated.data_._0_8_ = size;
    boost::numeric::ublas::
    vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
    vector<boost::numeric::ublas::zero_vector<double,std::allocator<double>>>
              ((vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                *)&res,(vector_expression<boost::numeric::ublas::zero_vector<double,_std::allocator<double>_>_>
                        *)&bUpdated);
    local_110 = (Matrix *)&b;
    local_108 = &H;
    boost::numeric::ublas::
    vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
    vector<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,double>>>
              ((vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                *)&bUpdated,
               (vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
                *)&local_110);
    if (-1 < local_f8->_m_falseNegativeObs) {
      pMVar6 = EventObservationModelMapping::GetMatrixPtr
                         (this_01,lastJAI,local_f8->_m_falseNegativeObs);
      this_02 = (matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                 *)operator_new(0x28);
      local_110 = pMVar5;
      local_108 = pMVar6;
      boost::numeric::ublas::
      matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
      ::
      matrix<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
                (this_02,(matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                          *)&local_110);
      iVar10 = 0;
      uVar9 = 0;
      dVar13 = 0.01;
      do {
        if ((dVar13 < 0.01) || (9 < uVar9)) goto LAB_0045af23;
        local_110 = (Matrix *)this_02;
        local_108 = &H;
        boost::numeric::ublas::
        indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,double>>>
                  (&H,(vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
                       *)&local_110);
        local_110 = (Matrix *)&b;
        local_108 = &H;
        boost::numeric::ublas::
        vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
        operator=((vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                   *)&res,(vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
                           *)&local_110);
        local_110 = (Matrix *)&bUpdated;
        local_108 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)&res;
        boost::numeric::ublas::
        vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
        operator=((vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                   *)&bUpdated,
                  (vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>_>
                   *)&local_110);
        rVar11 = boost::numeric::ublas::
                 sum<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                           ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                             *)&bUpdated);
        dVar12 = dVar13;
        if (0.0 < rVar11) {
          dVar12 = boost::numeric::ublas::
                   sum<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                             ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                               *)&res);
        }
        iVar10 = iVar10 + 1;
        if (dVar12 < dVar13) {
          iVar10 = 0;
        }
        iVar3 = 0;
        if (dVar13 != 0.0) {
          iVar3 = iVar10;
        }
        if (!NAN(dVar13)) {
          iVar10 = iVar3;
        }
        uVar9 = uVar9 + 1;
        dVar13 = dVar12;
      } while (iVar10 < 10);
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Warning: Event-driven belief update not converging! - The system has non-observable chains."
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
LAB_0045af23:
      boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                ((unbounded_array<double,_std::allocator<double>_> *)(this_02 + 0x10));
      operator_delete(this_02,0x28);
    }
    eta = boost::numeric::ublas::
          sum<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                    ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                      *)&bUpdated);
    pJVar1 = local_f8;
    if (eta <= 0.0) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Event-driven belief update failed: The system is badly conditioned. There is 0 probability of observing this symbol given this belief."
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      local_108 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)&eta;
      local_110 = (Matrix *)&bUpdated;
      boost::numeric::ublas::
      vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
      operator=((vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                 *)&bUpdated,
                (vector_expression<boost::numeric::ublas::vector_binary_scalar2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_const_double,_boost::numeric::ublas::scalar_divides<double,_double>_>_>
                 *)&local_110);
      lVar4 = *(long *)pJVar1;
      lVar8 = *(long *)(lVar4 + -0xd8);
      __position._M_current = *(double **)(&pJVar1->field_0x18 + lVar8);
      if (__position._M_current != *(double **)(&pJVar1->field_0x10 + lVar8)) {
        *(double **)(&pJVar1->field_0x18 + lVar8) = *(double **)(&pJVar1->field_0x10 + lVar8);
        lVar8 = *(long *)(lVar4 + -0xd8);
        __position._M_current = *(double **)(&pJVar1->field_0x18 + lVar8);
      }
      local_70.it_ = bUpdated.data_.data_ + bUpdated.data_.size_;
      local_60.it_ = bUpdated.data_.data_;
      local_70.
      super_container_reference<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      .c_ = (container_type *)&bUpdated;
      local_60.
      super_container_reference<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      .c_ = (container_type *)&bUpdated;
      std::vector<double,std::allocator<double>>::
      insert<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::iterator,void>
                ((vector<double,std::allocator<double>> *)(&pJVar1->field_0x10 + lVar8),__position,
                 &local_60,&local_70);
    }
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&m->data_);
    operator_delete(m,0x28);
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&bUpdated.data_);
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&res.data_);
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&b.data_);
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&H.data_);
    dVar13 = eta;
  }
  return dVar13;
}

Assistant:

double JointBeliefEventDriven::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                                      Index lastJAI, Index newJOI)
{
    using namespace boost::numeric::ublas;

    if(!pu.GetEventObservability())
        throw E("Trying to use a JointBeliefEventDriven on a model without event observability.");

    size_t nrS = pu.GetNrStates();
    
    const TransitionModelMapping *T = dynamic_cast<const TransitionModelMapping *>(pu.GetTransitionModelDiscretePtr());
    const EventObservationModelMapping *O = dynamic_cast<const EventObservationModelMapping *>(pu.GetObservationModelDiscretePtr());
    double eta = 0;
    if(T != 0 && O != 0)
    {
        using namespace boost::numeric::ublas;
      
        //we need to break the abstraction here since we'll be using ublas over T and O.
        //Ideally, we could have some kind of built in conversion.
        const matrix<double>* Ta = T->GetMatrixPtr(lastJAI);
        const matrix<double>* Oao = O->GetMatrixPtr(lastJAI,newJOI);
        matrix<double>* Hao = new matrix<double>(element_prod(*Ta,*Oao));
      
        matrix<double> H = *Hao;
      
        double epsilon, last_epsilon = 0;
      
        //We need b in ublas form.
        boost::numeric::ublas::vector<double> b(nrS);
        std::copy(_m_b.begin(), _m_b.end(), b.begin());

        boost::numeric::ublas::vector<double> res = zero_vector<double>(nrS);
        boost::numeric::ublas::vector<double> bUpdated = prod(b,H);
        epsilon = JointBeliefEventDriven_convergenceTh;
        if(_m_falseNegativeObs >= 0)
        {
            const matrix<double>* Oaf = O->GetMatrixPtr(lastJAI,_m_falseNegativeObs);
            //At this point we have two |S|x|S| matrices
            //What we want to do is; 
            //Hao = Ta.*Oao;
            //Haf = Ta.*Oaf;
            //b' = (b^T * (inv(I - Haf) * Hao))/n
            //Since we can't compute the inverse of arbitrarily large matrices, we have to approximate this
            //by cutting off the respective power series (I + Haf + Haf^2 + Haf^3 + ...) at some point.
            //Since Ta, Oao, Oaf are defined over (s,s') and we want to avoid having to transpose,
            //we have to left-multiply this by b^T to get the update
            //We also cannot rely on determinant / trace, so we have to keep track of b' and see if it is converging.

            matrix<double>* Haf = new matrix<double>(element_prod(*Ta,*Oaf));
            for(int safety_s=0, safety_h=0; 
                epsilon >= JointBeliefEventDriven_convergenceTh && safety_h < JointBeliefEventDriven_hardCap;
                safety_h++)
            {
                noalias(H) = prod(*Haf, H); //remember that we are implicitly using transposes.
                res = prod(b,H);
              
                bUpdated = bUpdated + res;
                last_epsilon = epsilon;
                if(sum(bUpdated) > 0)
                    epsilon = sum(res);
              
                if(last_epsilon != 0 && epsilon >= last_epsilon){
                    safety_s++;
                }else{
                    safety_s=0;
                }
                if(safety_s >= JointBeliefEventDriven_softCap){
                    cout << "Warning: Event-driven belief update not converging! - The system has non-observable chains." << endl;
                    break;
                }
            }
      
            delete Haf;
        }
        //only the normalization factor remains
        eta = sum(bUpdated);

        if(eta > 0)
        {
            bUpdated = bUpdated / eta;
      
            _m_b.clear();
            _m_b.insert(_m_b.end(), bUpdated.begin(), bUpdated.end());
        }
        else
        {
            cout << "Event-driven belief update failed: The system is badly conditioned. There is 0 probability of observing this symbol given this belief." << endl;
        }  
      
        delete Hao;      
    }
    
#if JointBeliefEventDriven_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBeliefEventDriven::Update SanityCheck failed"));
#endif

    return(eta);
}